

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetObjectFileDir
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  cmGlobalNinjaGenerator *pcVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  long *local_b8;
  undefined8 local_b0;
  long local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_58;
  undefined8 local_40;
  long *local_38;
  undefined1 *local_30;
  
  pcVar1 = this->LocalGenerator;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->HomeRelativeOutputPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pcVar1->HomeRelativeOutputPath)._M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_98,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar3 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar3->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_b8,pcVar3,config);
  local_58.first._M_len = local_98._M_string_length;
  local_58.first._M_str = local_98._M_dataplus._M_p;
  local_40 = local_b0;
  local_38 = local_b8;
  views._M_len = 2;
  views._M_array = &local_58;
  local_58.second = &local_98;
  local_30 = (undefined1 *)&local_b8;
  cmCatViews(&local_78,views);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetObjectFileDir(
  const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path +=
    cmStrCat(this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config));
  return path;
}